

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsBooleanToBool(JsValueRef value,bool *boolValue)

{
  bool bVar1;
  Data DVar2;
  undefined8 in_RAX;
  JavascriptBoolean *pJVar3;
  JsErrorCode JVar4;
  DebugCheckNoException local_28;
  
  if (value == (JsValueRef)0x0) {
    JVar4 = JsErrorInvalidArgument;
  }
  else if (boolValue == (bool *)0x0) {
    JVar4 = JsErrorNullArgument;
  }
  else {
    local_28._5_3_ = SUB83((ulong)in_RAX >> 0x28,0);
    local_28.__exceptionCheck.handledExceptionType = (ExceptionType)in_RAX;
    local_28.hasException = true;
    DVar2 = ExceptionCheck::Save();
    local_28.__exceptionCheck.handledExceptionType = DVar2.handledExceptionType;
    bVar1 = Js::VarIs<Js::JavascriptBoolean>(value);
    JVar4 = JsErrorInvalidArgument;
    if (bVar1) {
      pJVar3 = Js::VarTo<Js::JavascriptBoolean>(value);
      *boolValue = pJVar3->value != 0;
      JVar4 = JsNoError;
    }
    local_28.hasException = false;
    DebugCheckNoException::~DebugCheckNoException(&local_28);
  }
  return JVar4;
}

Assistant:

CHAKRA_API JsBooleanToBool(_In_ JsValueRef value, _Out_ bool *boolValue)
{
    VALIDATE_JSREF(value);
    PARAM_NOT_NULL(boolValue);

    BEGIN_JSRT_NO_EXCEPTION
    {
        if (!Js::VarIs<Js::JavascriptBoolean>(value))
        {
            RETURN_NO_EXCEPTION(JsErrorInvalidArgument);
        }

        *boolValue = Js::VarTo<Js::JavascriptBoolean>(value)->GetValue() ? true : false;
    }